

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool CMeshClosestPointMapper::RTreeCallback(void *a_context,ON__INT_PTR a_id)

{
  int local_4;
  
  if ((a_context != (void *)0x0) && (*(int *)((long)a_context + 0x40) < 0x3e9)) {
    ON_SimpleArray<int>::Append((ON_SimpleArray<int> *)((long)a_context + 0x30),&local_4);
    return true;
  }
  return false;
}

Assistant:

static bool RTreeCallback(void* a_context, ON__INT_PTR a_id)
	{
		if (nullptr == a_context)
			return false;
		CMeshClosestPointMapper& mapper = *(CMeshClosestPointMapper*)a_context;

		// Jussi, Apr 25 2024, RH-81671:
		// Stop collecting faces. There's probably a mismatch between the mapping and the geometry.
		if (mapper.m_resFis.Count() > 1000)
			return false;

		mapper.m_resFis.Append((int)a_id);

		return true;
	}